

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void CEngine::Con_DbgLognetwork(IResult *pResult,void *pUserData)

{
  CEngine *in_RSI;
  long in_FS_OFFSET;
  CEngine *pEngine;
  char aFilenameRecv [128];
  char aFilenameSent [128];
  char aBuf [32];
  undefined8 in_stack_fffffffffffffe98;
  CEngine *in_stack_fffffffffffffea0;
  IOHANDLE DataLogRecv;
  IOHANDLE in_stack_fffffffffffffea8;
  CEngine *this;
  char local_128 [112];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI->m_Logging & 1U) == 0) {
    str_timestamp((char *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20))
    ;
    str_format(&stack0xffffffffffffff58,0x80,"dumps/%s_network_sent_%s.txt",in_RSI->m_pAppname,
               local_28);
    str_format(local_128,0x80,"dumps/%s_network_recv_%s.txt",in_RSI->m_pAppname,local_28);
    this = in_RSI;
    (*(in_RSI->m_pStorage->super_IInterface)._vptr_IInterface[4])
              (in_RSI->m_pStorage,&stack0xffffffffffffff58,2,0,0,0,0,0);
    DataLogRecv = (IOHANDLE)0x0;
    (*(in_RSI->m_pStorage->super_IInterface)._vptr_IInterface[4])
              (in_RSI->m_pStorage,local_128,2,0,0,0,0);
    StartLogging(this,in_stack_fffffffffffffea8,DataLogRecv);
  }
  else {
    StopLogging(in_stack_fffffffffffffea0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Con_DbgLognetwork(IConsole::IResult *pResult, void *pUserData)
	{
		CEngine *pEngine = static_cast<CEngine *>(pUserData);

		if(pEngine->m_Logging)
		{
			pEngine->StopLogging();
		}
		else
		{
			char aBuf[32];
			str_timestamp(aBuf, sizeof(aBuf));
			char aFilenameSent[128], aFilenameRecv[128];
			str_format(aFilenameSent, sizeof(aFilenameSent), "dumps/%s_network_sent_%s.txt", pEngine->m_pAppname, aBuf);
			str_format(aFilenameRecv, sizeof(aFilenameRecv), "dumps/%s_network_recv_%s.txt", pEngine->m_pAppname, aBuf);
			pEngine->StartLogging(pEngine->m_pStorage->OpenFile(aFilenameSent, IOFLAG_WRITE, IStorage::TYPE_SAVE),
									pEngine->m_pStorage->OpenFile(aFilenameRecv, IOFLAG_WRITE, IStorage::TYPE_SAVE));
		}
	}